

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O0

void dxil_spv::emit_instrumentation_hash
               (SPIRVModule *module,InstructionInstrumentationState *instrumentation,Function *func,
               Id value_id,Id instruction_id)

{
  uint64_t uVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  uint u;
  Id id;
  Id id_00;
  MemorySemanticsMask MVar5;
  Builder *this;
  Block *this_00;
  Block *this_01;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  Instruction *this_02;
  Instruction *this_03;
  Instruction *this_04;
  Instruction *this_05;
  uint u_00;
  InstructionInstrumentationState *size;
  size_t size_00;
  Instruction *barrier_op2;
  Instruction *barrier_op;
  Instruction *shift_16;
  Instruction *composite;
  Id uvec4_type;
  Id control_chain_id;
  Id control_mask_id;
  Id cond_id;
  Id mask_id;
  Instruction *store_op;
  Instruction *atomic_need_write;
  Instruction *atomic_result_mask;
  Instruction *atomic_or;
  Instruction *access_chain;
  Instruction *control_mask;
  Instruction *control_bit;
  Instruction *control_word;
  Instruction *mask;
  Instruction *sub_1;
  Instruction *payload_size;
  Instruction *ext_hash;
  Instruction *mul;
  Instruction *load;
  Instruction *cookie_chain;
  Instruction *len_minus_2;
  Instruction *len;
  uint64_t shader_hash;
  Instruction *hash;
  Instruction *prime_mul;
  Id bool_type;
  Id u32_type;
  Block *merge_payload_path;
  Block *write_payload_path;
  Builder *builder;
  Id instruction_id_local;
  Id value_id_local;
  Function *func_local;
  InstructionInstrumentationState *instrumentation_local;
  SPIRVModule *module_local;
  
  size = instrumentation;
  this = SPIRVModule::get_builder(module);
  this_00 = (Block *)spv::Block::operator_new((Block *)0x78,(size_t)size);
  IVar2 = spv::Builder::getUniqueId(this);
  size_00 = (size_t)IVar2;
  spv::Block::Block(this_00,IVar2,func);
  this_01 = (Block *)spv::Block::operator_new((Block *)0x78,size_00);
  IVar2 = spv::Builder::getUniqueId(this);
  spv::Block::Block(this_01,IVar2,func);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar3 = spv::Builder::makeBoolType(this);
  pIVar6 = spv::Builder::addInstruction(this,IVar2,OpIMul);
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpBitwiseXor);
  spv::Instruction::addIdOperand(pIVar6,instruction_id);
  IVar4 = spv::Builder::makeUintConstant(this,0x61,false);
  spv::Instruction::addIdOperand(pIVar6,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar6);
  spv::Instruction::addIdOperand(pIVar7,IVar4);
  uVar1 = (instrumentation->info).shader_hash;
  u = (uint)(uVar1 >> 0x20);
  u_00 = (uint)uVar1;
  IVar4 = spv::Builder::makeUintConstant(this,u_00 ^ u,false);
  spv::Instruction::addIdOperand(pIVar7,IVar4);
  shader_hash = (uint64_t)pIVar7;
  builder._4_4_ = value_id;
  if (value_id == 0) {
    pIVar6 = spv::Builder::addInstruction(this,IVar2,OpArrayLength);
    spv::Instruction::addIdOperand(pIVar6,instrumentation->global_nan_inf_control_var_id);
    spv::Instruction::addImmediateOperand(pIVar6,0);
    pIVar8 = spv::Builder::addInstruction(this,IVar2,OpISub);
    IVar4 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar8,IVar4);
    IVar4 = spv::Builder::makeUintConstant(this,2,false);
    spv::Instruction::addIdOperand(pIVar8,IVar4);
    IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
    pIVar6 = spv::Builder::addInstruction(this,IVar4,OpAccessChain);
    spv::Instruction::addIdOperand(pIVar6,instrumentation->global_nan_inf_control_var_id);
    IVar4 = spv::Builder::makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar6,IVar4);
    IVar4 = spv::Instruction::getResultId(pIVar8);
    spv::Instruction::addIdOperand(pIVar6,IVar4);
    pIVar8 = spv::Builder::addInstruction(this,IVar2,OpLoad);
    IVar4 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar8,IVar4);
    builder._4_4_ = spv::Instruction::getResultId(pIVar8);
    pIVar6 = spv::Builder::addInstruction(this,IVar2,OpIMul);
    spv::Instruction::addIdOperand(pIVar6,builder._4_4_);
    IVar4 = spv::Builder::makeUintConstant(this,0xc881,false);
    spv::Instruction::addIdOperand(pIVar6,IVar4);
    shader_hash = (uint64_t)spv::Builder::addInstruction(this,IVar2,OpBitwiseXor);
    IVar4 = spv::Instruction::getResultId(pIVar7);
    spv::Instruction::addIdOperand((Instruction *)shader_hash,IVar4);
    IVar4 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand((Instruction *)shader_hash,IVar4);
  }
  pIVar6 = spv::Builder::addInstruction(this,IVar2,OpArrayLength);
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpISub);
  pIVar8 = spv::Builder::addInstruction(this,IVar2,OpBitwiseAnd);
  pIVar9 = spv::Builder::addInstruction(this,IVar2,OpShiftRightLogical);
  pIVar10 = spv::Builder::addInstruction(this,IVar2,OpBitwiseAnd);
  pIVar11 = spv::Builder::addInstruction(this,IVar2,OpShiftLeftLogical);
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
  pIVar12 = spv::Builder::addInstruction(this,IVar4,OpAccessChain);
  this_02 = spv::Builder::addInstruction(this,IVar2,OpAtomicOr);
  this_03 = spv::Builder::addInstruction(this,IVar2,OpBitwiseAnd);
  this_04 = spv::Builder::addInstruction(this,IVar3,OpIEqual);
  this_05 = spv::Builder::addInstruction(this,OpStore);
  spv::Instruction::addIdOperand(pIVar6,instrumentation->global_nan_inf_data_var_id);
  spv::Instruction::addImmediateOperand(pIVar6,0);
  IVar3 = spv::Instruction::getResultId(pIVar6);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  IVar3 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  IVar3 = spv::Instruction::getResultId((Instruction *)shader_hash);
  spv::Instruction::addIdOperand(pIVar8,IVar3);
  IVar3 = spv::Instruction::getResultId(pIVar7);
  spv::Instruction::addIdOperand(pIVar8,IVar3);
  IVar3 = spv::Instruction::getResultId(pIVar8);
  IVar4 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar9,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,4,false);
  spv::Instruction::addIdOperand(pIVar9,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar10,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,0xf,false);
  spv::Instruction::addIdOperand(pIVar10,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar11,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar10);
  spv::Instruction::addIdOperand(pIVar11,IVar4);
  spv::Instruction::addIdOperand(pIVar12,instrumentation->global_nan_inf_control_var_id);
  IVar4 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar12,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar9);
  spv::Instruction::addIdOperand(pIVar12,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar12);
  spv::Instruction::addIdOperand(this_02,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(this_02,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(this_02,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar11);
  spv::Instruction::addIdOperand(this_02,IVar4);
  IVar4 = spv::Instruction::getResultId(this_02);
  spv::Instruction::addIdOperand(this_03,IVar4);
  IVar4 = spv::Instruction::getResultId(pIVar11);
  spv::Instruction::addIdOperand(this_03,IVar4);
  IVar4 = spv::Instruction::getResultId(this_03);
  spv::Instruction::addIdOperand(this_04,IVar4);
  IVar4 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(this_04,IVar4);
  spv::Instruction::addIdOperand(this_05,instrumentation->should_report_instrumentation_id);
  IVar4 = spv::Builder::makeBoolConstant(this,false,false);
  spv::Instruction::addIdOperand(this_05,IVar4);
  IVar4 = spv::Instruction::getResultId(this_04);
  id = spv::Instruction::getResultId(pIVar11);
  id_00 = spv::Instruction::getResultId(pIVar12);
  spv::Builder::createSelectionMerge(this,this_01,0);
  spv::Builder::createConditionalBranch(this,IVar4,this_00,this_01);
  spv::Builder::setBuildPoint(this,this_00);
  IVar4 = spv::Builder::makeVectorType(this,IVar2,4);
  pIVar6 = spv::Builder::addInstruction(this,IVar4,OpCompositeConstruct);
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpShiftLeftLogical);
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar4);
  pIVar8 = spv::Builder::addInstruction(this,IVar4,OpAccessChain);
  pIVar9 = spv::Builder::addInstruction(this,OpStore);
  pIVar10 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  pIVar11 = spv::Builder::addInstruction(this,IVar2,OpAtomicOr);
  pIVar12 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  IVar2 = spv::Builder::makeUintConstant(this,u_00,false);
  spv::Instruction::addIdOperand(pIVar6,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,u,false);
  spv::Instruction::addIdOperand(pIVar6,IVar2);
  IVar2 = spv::Function::getParamId(func,1);
  spv::Instruction::addIdOperand(pIVar6,IVar2);
  spv::Instruction::addIdOperand(pIVar6,builder._4_4_);
  spv::Instruction::addIdOperand(pIVar7,id);
  IVar2 = spv::Builder::makeUintConstant(this,0x10,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  spv::Instruction::addIdOperand(pIVar8,instrumentation->global_nan_inf_data_var_id);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar8,IVar2);
  spv::Instruction::addIdOperand(pIVar8,IVar3);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar9,IVar2);
  IVar2 = spv::Instruction::getResultId(pIVar6);
  spv::Instruction::addIdOperand(pIVar9,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar10,IVar2);
  MVar5 = spv::operator|(MemorySemanticsUniformMemoryMask,MemorySemanticsAcquireReleaseMask);
  IVar2 = spv::Builder::makeUintConstant(this,MVar5,false);
  spv::Instruction::addIdOperand(pIVar10,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar12,IVar2);
  MVar5 = spv::operator|(MemorySemanticsUniformMemoryMask,MemorySemanticsAcquireReleaseMask);
  IVar2 = spv::Builder::makeUintConstant(this,MVar5,false);
  spv::Instruction::addIdOperand(pIVar12,IVar2);
  spv::Instruction::addIdOperand(pIVar11,id_00);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar11,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar11,IVar2);
  IVar2 = spv::Instruction::getResultId(pIVar7);
  spv::Instruction::addIdOperand(pIVar11,IVar2);
  spv::Builder::createBranch(this,this_01);
  spv::Builder::setBuildPoint(this,this_01);
  return;
}

Assistant:

void emit_instrumentation_hash(SPIRVModule &module, const InstructionInstrumentationState &instrumentation,
                               spv::Function *func, spv::Id value_id, spv::Id instruction_id)
{
	auto &builder = module.get_builder();
	auto *write_payload_path = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_payload_path = new spv::Block(builder.getUniqueId(), *func);

	spv::Id u32_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	auto *prime_mul = builder.addInstruction(u32_type, spv::OpIMul);
	auto *hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);

	prime_mul->addIdOperand(instruction_id);
	prime_mul->addIdOperand(builder.makeUintConstant(97)); // Arbitrary prime number

	hash->addIdOperand(prime_mul->getResultId());
	auto shader_hash = instrumentation.info.shader_hash;
	hash->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash) ^ uint32_t(shader_hash >> 32)));

	if (!value_id)
	{
		// For AssumeTrue instrumentation, we're more interested in the dispatch ID.
		// We've reserved space for it in the second last u32 of the control buffer.
		auto *len = builder.addInstruction(u32_type, spv::OpArrayLength);
		len->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		len->addImmediateOperand(0);

		auto *len_minus_2 = builder.addInstruction(u32_type, spv::OpISub);
		len_minus_2->addIdOperand(len->getResultId());
		len_minus_2->addIdOperand(builder.makeUintConstant(2));

		auto *cookie_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassStorageBuffer, u32_type), spv::OpAccessChain);
		cookie_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		cookie_chain->addIdOperand(builder.makeUintConstant(0));
		cookie_chain->addIdOperand(len_minus_2->getResultId());

		auto *load = builder.addInstruction(u32_type, spv::OpLoad);
		load->addIdOperand(cookie_chain->getResultId());
		value_id = load->getResultId();

		auto *mul = builder.addInstruction(u32_type, spv::OpIMul);
		mul->addIdOperand(value_id);
		mul->addIdOperand(builder.makeUintConstant(51329u));

		// Allow each dispatch to report their own faults.
		auto *ext_hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);
		ext_hash->addIdOperand(hash->getResultId());
		ext_hash->addIdOperand(mul->getResultId());

		hash = ext_hash;
	}

	auto *payload_size = builder.addInstruction(u32_type, spv::OpArrayLength);
	auto *sub_1 = builder.addInstruction(u32_type, spv::OpISub);
	auto *mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_word = builder.addInstruction(u32_type, spv::OpShiftRightLogical);
	auto *control_bit = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_mask = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
	auto *access_chain = builder.addInstruction(
	    builder.makePointer(spv::StorageClassStorageBuffer, u32_type),
	    spv::OpAccessChain);
	auto *atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
	auto *atomic_result_mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *atomic_need_write = builder.addInstruction(bool_type, spv::OpIEqual);
	auto *store_op = builder.addInstruction(spv::OpStore);

	payload_size->addIdOperand(instrumentation.global_nan_inf_data_var_id);
	payload_size->addImmediateOperand(0);
	sub_1->addIdOperand(payload_size->getResultId());
	sub_1->addIdOperand(builder.makeUintConstant(1));
	mask->addIdOperand(hash->getResultId());
	mask->addIdOperand(sub_1->getResultId());
	spv::Id mask_id = mask->getResultId();

	control_word->addIdOperand(mask->getResultId());
	control_word->addIdOperand(builder.makeUintConstant(4));
	control_bit->addIdOperand(mask->getResultId());
	control_bit->addIdOperand(builder.makeUintConstant(15));
	control_mask->addIdOperand(builder.makeUintConstant(1));
	control_mask->addIdOperand(control_bit->getResultId());

	access_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
	access_chain->addIdOperand(builder.makeUintConstant(0));
	access_chain->addIdOperand(control_word->getResultId());

	atomic_or->addIdOperand(access_chain->getResultId());
	atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_or->addIdOperand(builder.makeUintConstant(0));
	atomic_or->addIdOperand(control_mask->getResultId());

	atomic_result_mask->addIdOperand(atomic_or->getResultId());
	atomic_result_mask->addIdOperand(control_mask->getResultId());
	atomic_need_write->addIdOperand(atomic_result_mask->getResultId());
	atomic_need_write->addIdOperand(builder.makeUintConstant(0));

	store_op->addIdOperand(instrumentation.should_report_instrumentation_id);
	store_op->addIdOperand(builder.makeBoolConstant(false));

	spv::Id cond_id = atomic_need_write->getResultId();
	spv::Id control_mask_id = control_mask->getResultId();
	spv::Id control_chain_id = access_chain->getResultId();

	builder.createSelectionMerge(merge_payload_path, 0);
	builder.createConditionalBranch(cond_id, write_payload_path, merge_payload_path);
	builder.setBuildPoint(write_payload_path);
	{
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);

		auto *composite = builder.addInstruction(uvec4_type, spv::OpCompositeConstruct);
		auto *shift_16 = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
		access_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassStorageBuffer, uvec4_type),
			spv::OpAccessChain);
		store_op = builder.addInstruction(spv::OpStore);
		auto *barrier_op = builder.addInstruction(spv::OpMemoryBarrier);
		atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
		// Important this comes after the atomic or.
		auto *barrier_op2 = builder.addInstruction(spv::OpMemoryBarrier);

		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 0)));
		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 32)));
		composite->addIdOperand(func->getParamId(1));
		composite->addIdOperand(value_id);

		shift_16->addIdOperand(control_mask_id);
		shift_16->addIdOperand(builder.makeUintConstant(16));

		access_chain->addIdOperand(instrumentation.global_nan_inf_data_var_id);
		access_chain->addIdOperand(builder.makeUintConstant(0));
		access_chain->addIdOperand(mask_id);

		store_op->addIdOperand(access_chain->getResultId());
		store_op->addIdOperand(composite->getResultId());

		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                  spv::MemorySemanticsAcquireReleaseMask));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                   spv::MemorySemanticsAcquireReleaseMask));

		atomic_or->addIdOperand(control_chain_id);
		atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_or->addIdOperand(builder.makeUintConstant(0));
		atomic_or->addIdOperand(shift_16->getResultId());

		builder.createBranch(merge_payload_path);
	}
	builder.setBuildPoint(merge_payload_path);
}